

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void btSwapRowsAndCols(btScalar **A,int n,int i1,int i2,int nskip,int do_fast_row_swaps)

{
  btScalar bVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  btScalar tmp_1;
  btScalar *A_j;
  int j;
  btScalar tmp;
  int k;
  btScalar *A_i_i1;
  int i;
  btScalar *A_i2;
  btScalar *A_i1;
  int do_fast_row_swaps_local;
  int nskip_local;
  int i2_local;
  int i1_local;
  int n_local;
  btScalar **A_local;
  
  pbVar2 = A[i1];
  pbVar3 = A[i2];
  for (i = i1 + 1; i < i2; i = i + 1) {
    pbVar4 = A[i];
    pbVar2[i] = pbVar4[i1];
    pbVar4[i1] = pbVar3[i];
  }
  pbVar2[i2] = pbVar2[i1];
  pbVar2[i1] = pbVar3[i1];
  pbVar3[i1] = pbVar3[i2];
  if (do_fast_row_swaps == 0) {
    for (k = 0; k <= i2; k = k + 1) {
      bVar1 = pbVar2[k];
      pbVar2[k] = pbVar3[k];
      pbVar3[k] = bVar1;
    }
  }
  else {
    A[i1] = pbVar3;
    A[i2] = pbVar2;
  }
  for (j = i2 + 1; j < n; j = j + 1) {
    pbVar2 = A[j];
    bVar1 = pbVar2[i1];
    pbVar2[i1] = pbVar2[i2];
    pbVar2[i2] = bVar1;
  }
  return;
}

Assistant:

static void btSwapRowsAndCols (BTATYPE A, int n, int i1, int i2, int nskip, 
  int do_fast_row_swaps)
{
  btAssert (A && n > 0 && i1 >= 0 && i2 >= 0 && i1 < n && i2 < n &&
    nskip >= n && i1 < i2);

# ifdef BTROWPTRS
  btScalar *A_i1 = A[i1];
  btScalar *A_i2 = A[i2];
  for (int i=i1+1; i<i2; ++i) {
    btScalar *A_i_i1 = A[i] + i1;
    A_i1[i] = *A_i_i1;
    *A_i_i1 = A_i2[i];
  }
  A_i1[i2] = A_i1[i1];
  A_i1[i1] = A_i2[i1];
  A_i2[i1] = A_i2[i2];
  // swap rows, by swapping row pointers
  if (do_fast_row_swaps) {
    A[i1] = A_i2;
    A[i2] = A_i1;
  }
  else {
    // Only swap till i2 column to match A plain storage variant.
    for (int k = 0; k <= i2; ++k) {
      btScalar tmp = A_i1[k];
      A_i1[k] = A_i2[k];
      A_i2[k] = tmp;
    }
  }
  // swap columns the hard way
  for (int j=i2+1; j<n; ++j) {
    btScalar *A_j = A[j];
    btScalar tmp = A_j[i1];
    A_j[i1] = A_j[i2];
    A_j[i2] = tmp;
  }
# else
  btScalar *A_i1 = A+i1*nskip;
  btScalar *A_i2 = A+i2*nskip;
  for (int k = 0; k < i1; ++k) {
    btScalar tmp = A_i1[k];
    A_i1[k] = A_i2[k];
    A_i2[k] = tmp;
  }
  btScalar *A_i = A_i1 + nskip;
  for (int i=i1+1; i<i2; A_i+=nskip, ++i) {
    btScalar tmp = A_i2[i];
    A_i2[i] = A_i[i1];
    A_i[i1] = tmp;
  }
  {
    btScalar tmp = A_i1[i1];
    A_i1[i1] = A_i2[i2];
    A_i2[i2] = tmp;
  }
  btScalar *A_j = A_i2 + nskip;
  for (int j=i2+1; j<n; A_j+=nskip, ++j) {
    btScalar tmp = A_j[i1];
    A_j[i1] = A_j[i2];
    A_j[i2] = tmp;
  }
# endif
}